

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

unsigned_long __thiscall tetgenmesh::randomnation(tetgenmesh *this,uint choices)

{
  ulong uVar1;
  unsigned_long newrandom;
  uint choices_local;
  tetgenmesh *this_local;
  
  if (choices < 0xae529) {
    this->randomseed = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
    this_local = (tetgenmesh *)(this->randomseed % (ulong)choices);
  }
  else {
    uVar1 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
    this->randomseed = (uVar1 * 0x556 + 0x24d69) % 0xae529;
    this_local = (tetgenmesh *)(uVar1 * ((ulong)choices / 0xae529) + this->randomseed);
    if ((tetgenmesh *)(ulong)choices <= this_local) {
      this_local = (tetgenmesh *)((long)this_local - (ulong)choices);
    }
  }
  return (unsigned_long)this_local;
}

Assistant:

unsigned long tetgenmesh::randomnation(unsigned int choices)
{
  unsigned long newrandom;

  if (choices >= 714025l) {
    newrandom = (randomseed * 1366l + 150889l) % 714025l;
    randomseed = (newrandom * 1366l + 150889l) % 714025l;
    newrandom = newrandom * (choices / 714025l) + randomseed;
    if (newrandom >= choices) {
      return newrandom - choices;
    } else {
      return newrandom;
    }
  } else {
    randomseed = (randomseed * 1366l + 150889l) % 714025l;
    return randomseed % choices;
  }
}